

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<GPollFDWithQSocketNotifier*>::emplace<GPollFDWithQSocketNotifier*&>
          (QPodArrayOps<GPollFDWithQSocketNotifier_*> *this,qsizetype i,
          GPollFDWithQSocketNotifier **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  GPollFDWithQSocketNotifier **ppGVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<GPollFDWithQSocketNotifier_*> *in_RDI;
  GPollFDWithQSocketNotifier **where;
  GrowthPosition pos;
  GPollFDWithQSocketNotifier *tmp;
  bool detach;
  QArrayDataPointer<GPollFDWithQSocketNotifier_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  GPollFDWithQSocketNotifier *pGVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<GPollFDWithQSocketNotifier_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<GPollFDWithQSocketNotifier_*>::freeSpaceAtEnd
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppGVar3 = QArrayDataPointer<GPollFDWithQSocketNotifier_*>::end(in_RDI);
      *ppGVar3 = (GPollFDWithQSocketNotifier *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<GPollFDWithQSocketNotifier_*>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppGVar3 = QArrayDataPointer<GPollFDWithQSocketNotifier_*>::begin
                          ((QArrayDataPointer<GPollFDWithQSocketNotifier_*> *)0x8d1e77);
      ppGVar3[-1] = (GPollFDWithQSocketNotifier *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pGVar5 = (GPollFDWithQSocketNotifier *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<GPollFDWithQSocketNotifier_*>::detachAndGrow
            ((QArrayDataPointer<GPollFDWithQSocketNotifier_*> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),(GrowthPosition)((ulong)pGVar5 >> 0x20),
             CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (GPollFDWithQSocketNotifier ***)in_stack_ffffffffffffffc8,in_RDI);
  ppGVar3 = QPodArrayOps<GPollFDWithQSocketNotifier_*>::createHole
                      ((QPodArrayOps<GPollFDWithQSocketNotifier_*> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pGVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppGVar3 = pGVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }